

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp-getelement2.cpp
# Opt level: O2

Object * ICM::getIdentData(Element *elt)

{
  uint8_t uVar1;
  byte bVar2;
  Object *pOVar3;
  FuncTableUnit *pFVar4;
  IdentTableUnit *pIVar5;
  anon_union_8_5_d85425f2_for_IdentTableUnit_4 local_20;
  undefined8 local_18;
  
  uVar1 = (elt->field_0).field_0.stype;
  bVar2 = (elt->field_0).field_0.etype ^ 3;
  if (uVar1 == '\x04' && bVar2 == 0) {
    pOVar3 = getDyVarbData(elt);
    return pOVar3;
  }
  if (uVar1 == '\x01' && bVar2 == 0) {
    pOVar3 = getConstData(elt);
    return pOVar3;
  }
  if (uVar1 == '\x02' && bVar2 == 0) {
    pOVar3 = (Object *)operator_new(0x10);
    pFVar4 = getStFunc(elt);
    local_20 = (anon_union_8_5_d85425f2_for_IdentTableUnit_4)pFVar4->id;
    local_18 = 0xffffffffffffffff;
    Objects::DataObject<(ICM::DefaultType)11>::DataObject
              ((DataObject<(ICM::DefaultType)11> *)pOVar3,(T *)&local_20);
  }
  else if (bVar2 == 0 && uVar1 == '\a') {
    pOVar3 = (Object *)operator_new(0x10);
    pIVar5 = getFromIdentTable((IdentIndex *)&elt->index);
    local_20 = pIVar5->field_3;
    Objects::DataObject<(ICM::DefaultType)14>::DataObject
              ((DataObject<(ICM::DefaultType)14> *)pOVar3,(T *)&local_20);
  }
  else {
    pOVar3 = (Object *)0x0;
  }
  return pOVar3;
}

Assistant:

Object* getIdentData(const Instruction::Element &elt) {
		if (elt.isIdentType(I_DyVarb)) {
			return getDyVarbData(elt);
		}
		else if (elt.isIdentType(I_Data)) {
			return getConstData(elt);
		}
		else if (elt.isIdentType(I_StFunc)) {
			return new Objects::Function(getStFunc(elt).getID());
		}
		else if (elt.isIdentType(I_Type)) {
			return new Objects::Type(getFromIdentTable(elt.getIdentIndex()).TypeIndex);
		}
		return nullptr;
	}